

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::logMessage
          (FederateState *this,int level,string_view logMessageSource,string_view message,
          bool fromRemote)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  string *psVar3;
  size_type sVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view header_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view logMessageSource_local;
  string timeString;
  string header;
  string local_88;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)message._M_str;
  logMessageSource_local._M_str = logMessageSource._M_str;
  sVar4 = logMessageSource._M_len;
  if (this->maxLogLevel < level && !fromRemote) {
    return;
  }
  header._M_dataplus._M_p = (pointer)&header.field_2;
  header._M_string_length = 0;
  header.field_2._M_local_buf[0] = '\0';
  uVar1 = (this->time_granted).internalTimeCode;
  timeString._M_dataplus._M_p = (pointer)&timeString.field_2;
  timeString._M_string_length = 0;
  timeString.field_2._M_local_buf[0] = '\0';
  logMessageSource_local._M_len = sVar4;
  if ((long)uVar1 < 0) {
    psVar3 = fedStateString_abi_cxx11_((this->state)._M_i);
    local_88._M_dataplus._M_p = (psVar3->_M_dataplus)._M_p;
    local_88._M_string_length = psVar3->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x4;
    args.field_1.values_ = args_00.field_1.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)0x38e129,fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&timeString,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    sVar4 = logMessageSource_local._M_len;
  }
  else if (uVar1 == 0x7fffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&timeString,"[MAXTIME]");
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    local_88._M_dataplus._M_p =
         (pointer)((double)SUB164(auVar2 % ZEXT816(1000000000),0) * 1e-09 +
                  (double)(uVar1 / 1000000000));
    fmt_00.size_ = 10;
    fmt_00.data_ = (char *)0x4;
    args_00.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)0x38e129,fmt_00,args_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&timeString,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (sVar4 == 0) {
    local_68._M_dataplus._M_p = (this->name)._M_dataplus._M_p;
    local_68._M_string_length = (this->name)._M_string_length;
    local_68.field_2._M_allocated_capacity._0_4_ = (this->global_id)._M_i.gid;
    local_48 = timeString._M_dataplus._M_p;
    sStack_40 = timeString._M_string_length;
    fmt_01.size_ = 0xd1d;
    fmt_01.data_ = (char *)0x9;
    args_01.field_1.values_ = args_00.field_1.values_;
    args_01.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"{} ({}){}",fmt_01,args_01);
  }
  else {
    if (logMessageSource_local._M_str[sVar4 - 1] == ']') {
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&header,&logMessageSource_local);
      goto LAB_002b0f0b;
    }
    local_68._M_dataplus._M_p = logMessageSource_local._M_str;
    local_68.field_2._M_allocated_capacity = (size_type)timeString._M_dataplus._M_p;
    local_68.field_2._8_8_ = timeString._M_string_length;
    fmt_02.size_ = 0xdd;
    fmt_02.data_ = (char *)0x4;
    args_02.field_1.values_ = args_00.field_1.values_;
    args_02.desc_ = (unsigned_long_long)&local_68;
    local_68._M_string_length = sVar4;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)0x39fad0,fmt_02,args_02);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&header,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
LAB_002b0f0b:
  header_00._M_str = header._M_dataplus._M_p;
  header_00._M_len = header._M_string_length;
  LogManager::sendToLogger
            ((this->mLogManager)._M_t.
             super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
             super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl,level,header_00,
             (string_view)message,fromRemote);
  std::__cxx11::string::~string((string *)&timeString);
  std::__cxx11::string::~string((string *)&header);
  return;
}

Assistant:

void FederateState::logMessage(int level,
                               std::string_view logMessageSource,
                               std::string_view message,
                               bool fromRemote) const
{
    if (level > maxLogLevel && !fromRemote) {
        return;
    }
    std::string header;
    auto currentTime = grantedTime();
    std::string timeString;
    if (currentTime < timeZero) {
        timeString = fmt::format("[{}]", fedStateString(getState()));
    } else if (currentTime == Time::maxVal()) {
        timeString = "[MAXTIME]";
    } else {
        timeString = fmt::format("[{}]", static_cast<double>(grantedTime()));
    }
    if (logMessageSource.empty()) {
        header = fmt::format("{} ({}){}", name, global_id.load().baseValue(), timeString);
    } else if (logMessageSource.back() == ']') {
        header = logMessageSource;
    } else {
        header = fmt::format("{}{}", logMessageSource, timeString);
    }

    mLogManager->sendToLogger(level, header, message, fromRemote);
}